

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

string_t __thiscall
duckdb::FSSTVector::AddCompressedString(FSSTVector *this,Vector *vector,string_t data)

{
  VectorStringBuffer *this_00;
  string_t sVar1;
  string_t sVar2;
  shared_ptr<duckdb::VectorFSSTStringBuffer,_true> local_30;
  
  sVar1.value._8_8_ = data.value._0_8_;
  if (0xc < (uint)vector) {
    this_00 = *(VectorStringBuffer **)(this + 0x58);
    if (this_00 == (VectorStringBuffer *)0x0) {
      make_shared_ptr<duckdb::VectorFSSTStringBuffer>();
      shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorFSSTStringBuffer,_0>
                ((shared_ptr<duckdb::VectorBuffer,_true> *)(this + 0x58),&local_30);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_30.internal.
                  super___shared_ptr<duckdb::VectorFSSTStringBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      this_00 = *(VectorStringBuffer **)(this + 0x58);
    }
    sVar1.value._0_8_ = vector;
    sVar1 = VectorStringBuffer::AddBlob(this_00,sVar1);
    vector = sVar1.value._0_8_;
  }
  sVar2.value.pointer.ptr = (char *)sVar1.value._8_8_;
  sVar2.value._0_8_ = vector;
  return (string_t)sVar2.value;
}

Assistant:

string_t FSSTVector::AddCompressedString(Vector &vector, string_t data) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);
	if (data.IsInlined()) {
		// string will be inlined: no need to store in string heap
		return data;
	}
	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);
	auto &fsst_string_buffer = vector.auxiliary.get()->Cast<VectorFSSTStringBuffer>();
	return fsst_string_buffer.AddBlob(data);
}